

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O0

ngx_int_t ngx_walk_tree(ngx_tree_ctx_t *ctx,ngx_str_t *tree)

{
  ngx_log_t *pnVar1;
  void *pvVar2;
  DIR *pDVar3;
  size_t sVar4;
  int iVar5;
  ngx_int_t nVar6;
  int *piVar7;
  size_t sVar8;
  DIR *__src;
  undefined1 *puVar9;
  long lVar10;
  __dev_t local_140;
  undefined1 local_120 [8];
  ngx_dir_t dir;
  ngx_str_t buf;
  ngx_str_t file;
  ngx_int_t nStack_50;
  ngx_err_t err;
  ngx_int_t rc;
  size_t len;
  u_char *name;
  u_char *p;
  void *prev;
  void *data;
  ngx_str_t *tree_local;
  ngx_tree_ctx_t *ctx_local;
  
  dir._160_8_ = 0;
  buf.len = 0;
  if ((ctx->log->log_level & 0x10) != 0) {
    ngx_log_error_core(8,ctx->log,0,"walk tree \"%V\"",tree);
  }
  nVar6 = ngx_open_dir(tree,(ngx_dir_t *)local_120);
  if (nVar6 == -1) {
    if (2 < ctx->log->log_level) {
      pnVar1 = ctx->log;
      piVar7 = __errno_location();
      ngx_log_error_core(3,pnVar1,*piVar7,"opendir() \"%s\" failed",tree->data);
    }
    return -1;
  }
  pvVar2 = ctx->data;
  if (ctx->alloc == 0) {
    prev = (void *)0x0;
  }
  else {
    prev = ngx_alloc(ctx->alloc,ctx->log);
    if ((prev == (void *)0x0) || (nVar6 = (*ctx->init_handler)(prev,pvVar2), nVar6 == -6))
    goto LAB_0012480a;
    ctx->data = prev;
  }
LAB_001242c3:
  do {
    while( true ) {
      while( true ) {
        do {
          piVar7 = __errno_location();
          *piVar7 = 0;
          nVar6 = ngx_read_dir((ngx_dir_t *)local_120);
          if (nVar6 == -1) {
            piVar7 = __errno_location();
            if (*piVar7 == 0) {
              nStack_50 = 0;
            }
            else {
              if (2 < ctx->log->log_level) {
                ngx_log_error_core(3,ctx->log,*piVar7,"readdir() \"%s\" failed",tree->data);
              }
              nStack_50 = -1;
            }
            goto LAB_00124812;
          }
          sVar8 = strlen((char *)(dir.dir + 0x13));
          pDVar3 = dir.dir;
          __src = dir.dir + 0x13;
          if ((ctx->log->log_level & 0x10) != 0) {
            ngx_log_error_core(8,ctx->log,0,"tree name %uz:\"%s\"",sVar8,__src);
          }
        } while (((sVar8 == 1) && (*__src == (DIR)0x2e)) ||
                ((sVar8 == 2 && ((*__src == (DIR)0x2e && (pDVar3[0x14] == (DIR)0x2e))))));
        buf.data = (u_char *)(tree->len + 1 + sVar8);
        if ((ulong)dir._160_8_ < buf.data) {
          if (dir._160_8_ != 0) {
            free((void *)buf.len);
          }
          dir._160_8_ = tree->len + 1 + sVar8;
          buf.len = (size_t)ngx_alloc(dir._160_8_ + 1,ctx->log);
          if ((void *)buf.len == (void *)0x0) goto LAB_0012480a;
        }
        sVar4 = buf.len;
        memcpy((void *)buf.len,tree->data,tree->len);
        puVar9 = (undefined1 *)(sVar4 + tree->len);
        *puVar9 = 0x2f;
        memcpy(puVar9 + 1,__src,sVar8 + 1);
        sVar4 = buf.len;
        if ((ctx->log->log_level & 0x10) != 0) {
          ngx_log_error_core(8,ctx->log,0,"tree path \"%s\"",buf.len);
        }
        if ((((ushort)dir.info.__glibc_reserved[2] >> 8 & 1) != 0) ||
           (nVar6 = ngx_de_info((u_char *)sVar4,(ngx_dir_t *)local_120), nVar6 != -1)) break;
        if (2 < ctx->log->log_level) {
          pnVar1 = ctx->log;
          piVar7 = __errno_location();
          ngx_log_error_core(3,pnVar1,*piVar7,"stat() \"%s\" failed",sVar4);
        }
      }
      if (((ushort)dir.info.__glibc_reserved[2] & 0xff) != 0) break;
      if (((uint)dir.info.st_nlink & 0xf000) != 0x8000) goto LAB_0012465c;
LAB_00124588:
      if ((ctx->log->log_level & 0x10) != 0) {
        ngx_log_error_core(8,ctx->log,0,"tree file \"%s\"",sVar4);
      }
      ctx->size = dir.info.st_rdev;
      if ((long)dir.info.st_rdev < dir.info.st_blksize * 0x200) {
        local_140 = dir.info.st_blksize << 9;
      }
      else {
        local_140 = dir.info.st_rdev;
      }
      ctx->fs_size = local_140;
      ctx->access = (ulong)((uint)dir.info.st_nlink & 0x1ff);
      ctx->mtime = dir.info.st_atim.tv_nsec;
      lVar10 = (*ctx->file_handler)(ctx,(ngx_str_t *)&buf.data);
joined_r0x001247ab:
      if (lVar10 == -6) goto LAB_0012480a;
    }
    if (((ushort)dir.info.__glibc_reserved[2] & 0xff) == 8) goto LAB_00124588;
LAB_0012465c:
    if (((ushort)dir.info.__glibc_reserved[2] & 0xff) == 0) {
      if (((uint)dir.info.st_nlink & 0xf000) != 0x4000) goto LAB_001247b1;
LAB_00124697:
      if ((ctx->log->log_level & 0x10) != 0) {
        ngx_log_error_core(8,ctx->log,0,"tree enter dir \"%s\"",sVar4);
      }
      ctx->access = (ulong)((uint)dir.info.st_nlink & 0x1ff);
      ctx->mtime = dir.info.st_atim.tv_nsec;
      nVar6 = (*ctx->pre_tree_handler)(ctx,(ngx_str_t *)&buf.data);
      if (nVar6 == -6) break;
      if (nVar6 != -5) {
        nVar6 = ngx_walk_tree(ctx,(ngx_str_t *)&buf.data);
        if (nVar6 != -6) {
          ctx->access = (ulong)((uint)dir.info.st_nlink & 0x1ff);
          ctx->mtime = dir.info.st_atim.tv_nsec;
          lVar10 = (*ctx->post_tree_handler)(ctx,(ngx_str_t *)&buf.data);
          goto joined_r0x001247ab;
        }
        break;
      }
      if ((ctx->log->log_level & 0x10) != 0) {
        ngx_log_error_core(8,ctx->log,0,"tree skip dir \"%s\"",sVar4);
      }
      goto LAB_001242c3;
    }
    if (((ushort)dir.info.__glibc_reserved[2] & 0xff) == 4) goto LAB_00124697;
LAB_001247b1:
    if ((ctx->log->log_level & 0x10) != 0) {
      ngx_log_error_core(8,ctx->log,0,"tree special \"%s\"",sVar4);
    }
    nVar6 = (*ctx->spec_handler)(ctx,(ngx_str_t *)&buf.data);
  } while (nVar6 != -6);
LAB_0012480a:
  nStack_50 = -6;
LAB_00124812:
  if (dir._160_8_ != 0) {
    free((void *)buf.len);
  }
  if (prev != (void *)0x0) {
    free(prev);
    ctx->data = pvVar2;
  }
  iVar5 = closedir((DIR *)local_120);
  if ((iVar5 == -1) && (2 < ctx->log->log_level)) {
    pnVar1 = ctx->log;
    piVar7 = __errno_location();
    ngx_log_error_core(3,pnVar1,*piVar7,"closedir() \"%s\" failed",tree->data);
  }
  return nStack_50;
}

Assistant:

ngx_int_t
ngx_walk_tree(ngx_tree_ctx_t *ctx, ngx_str_t *tree)
{
    void       *data, *prev;
    u_char     *p, *name;
    size_t      len;
    ngx_int_t   rc;
    ngx_err_t   err;
    ngx_str_t   file, buf;
    ngx_dir_t   dir;

    ngx_str_null(&buf);

    ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                   "walk tree \"%V\"", tree);

    if (ngx_open_dir(tree, &dir) == NGX_ERROR) {
        ngx_log_error(NGX_LOG_CRIT, ctx->log, ngx_errno,
                      ngx_open_dir_n " \"%s\" failed", tree->data);
        return NGX_ERROR;
    }

    prev = ctx->data;

    if (ctx->alloc) {
        data = ngx_alloc(ctx->alloc, ctx->log);
        if (data == NULL) {
            goto failed;
        }

        if (ctx->init_handler(data, prev) == NGX_ABORT) {
            goto failed;
        }

        ctx->data = data;

    } else {
        data = NULL;
    }

    for ( ;; ) {

        ngx_set_errno(0);

        if (ngx_read_dir(&dir) == NGX_ERROR) {
            err = ngx_errno;

            if (err == NGX_ENOMOREFILES) {
                rc = NGX_OK;

            } else {
                ngx_log_error(NGX_LOG_CRIT, ctx->log, err,
                              ngx_read_dir_n " \"%s\" failed", tree->data);
                rc = NGX_ERROR;
            }

            goto done;
        }

        len = ngx_de_namelen(&dir);
        name = ngx_de_name(&dir);

        ngx_log_debug2(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                      "tree name %uz:\"%s\"", len, name);

        if (len == 1 && name[0] == '.') {
            continue;
        }

        if (len == 2 && name[0] == '.' && name[1] == '.') {
            continue;
        }

        file.len = tree->len + 1 + len;

        if (file.len + NGX_DIR_MASK_LEN > buf.len) {

            if (buf.len) {
                ngx_free(buf.data);
            }

            buf.len = tree->len + 1 + len + NGX_DIR_MASK_LEN;

            buf.data = ngx_alloc(buf.len + 1, ctx->log);
            if (buf.data == NULL) {
                goto failed;
            }
        }

        p = ngx_cpymem(buf.data, tree->data, tree->len);
        *p++ = '/';
        ngx_memcpy(p, name, len + 1);

        file.data = buf.data;

        ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                       "tree path \"%s\"", file.data);

        if (!dir.valid_info) {
            if (ngx_de_info(file.data, &dir) == NGX_FILE_ERROR) {
                ngx_log_error(NGX_LOG_CRIT, ctx->log, ngx_errno,
                              ngx_de_info_n " \"%s\" failed", file.data);
                continue;
            }
        }

        if (ngx_de_is_file(&dir)) {

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                           "tree file \"%s\"", file.data);

            ctx->size = ngx_de_size(&dir);
            ctx->fs_size = ngx_de_fs_size(&dir);
            ctx->access = ngx_de_access(&dir);
            ctx->mtime = ngx_de_mtime(&dir);

            if (ctx->file_handler(ctx, &file) == NGX_ABORT) {
                goto failed;
            }

        } else if (ngx_de_is_dir(&dir)) {

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                           "tree enter dir \"%s\"", file.data);

            ctx->access = ngx_de_access(&dir);
            ctx->mtime = ngx_de_mtime(&dir);

            rc = ctx->pre_tree_handler(ctx, &file);

            if (rc == NGX_ABORT) {
                goto failed;
            }

            if (rc == NGX_DECLINED) {
                ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                               "tree skip dir \"%s\"", file.data);
                continue;
            }

            if (ngx_walk_tree(ctx, &file) == NGX_ABORT) {
                goto failed;
            }

            ctx->access = ngx_de_access(&dir);
            ctx->mtime = ngx_de_mtime(&dir);

            if (ctx->post_tree_handler(ctx, &file) == NGX_ABORT) {
                goto failed;
            }

        } else {

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                           "tree special \"%s\"", file.data);

            if (ctx->spec_handler(ctx, &file) == NGX_ABORT) {
                goto failed;
            }
        }
    }

failed:

    rc = NGX_ABORT;

done:

    if (buf.len) {
        ngx_free(buf.data);
    }

    if (data) {
        ngx_free(data);
        ctx->data = prev;
    }

    if (ngx_close_dir(&dir) == NGX_ERROR) {
        ngx_log_error(NGX_LOG_CRIT, ctx->log, ngx_errno,
                      ngx_close_dir_n " \"%s\" failed", tree->data);
    }

    return rc;
}